

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

Real __thiscall
amrex::MLNodeLinOp::xdoty(MLNodeLinOp *this,int amrlev,int mglev,MultiFab *x,MultiFab *y,bool local)

{
  int ncomp;
  Real RVar1;
  MultiFab *src;
  int dstcomp;
  MultiFab tmp;
  FabFactory<amrex::FArrayBox> local_1e0;
  MFInfo local_1d8;
  MultiFab local_1a8;
  
  src = &this->m_bottom_dot_mask;
  if (mglev + 1 !=
      *(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start) {
    src = &this->m_coarse_dot_mask;
  }
  ncomp = (y->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  local_1d8.alloc = true;
  local_1d8._1_7_ = 0;
  local_1d8.arena = (Arena *)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074e8d0;
  MultiFab::MultiFab(&local_1a8,&(x->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                     &(x->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,ncomp
                     ,0,&local_1d8,&local_1e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  MultiFab::Copy(&local_1a8,x,0,0,ncomp,0);
  if (0 < ncomp) {
    dstcomp = 0;
    do {
      MultiFab::Multiply(&local_1a8,src,0,dstcomp,1,0);
      dstcomp = dstcomp + 1;
    } while (ncomp != dstcomp);
  }
  RVar1 = MultiFab::Dot(&local_1a8,0,y,0,ncomp,0,true);
  MultiFab::~MultiFab(&local_1a8);
  return RVar1;
}

Assistant:

Real
MLNodeLinOp::xdoty (int amrlev, int mglev, const MultiFab& x, const MultiFab& y, bool local) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0);
    AMREX_ASSERT(mglev+1==m_num_mg_levels[0] || mglev==0);
    const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
    const int ncomp = y.nComp();
    const int nghost = 0;
    MultiFab tmp(x.boxArray(), x.DistributionMap(), ncomp, 0);
    MultiFab::Copy(tmp, x, 0, 0, ncomp, nghost);
    for (int i = 0; i < ncomp; i++) {
        MultiFab::Multiply(tmp, mask, 0, i, 1, nghost);
    }
    Real result = MultiFab::Dot(tmp,0,y,0,ncomp,nghost,true);
    if (!local) {
        ParallelAllReduce::Sum(result, ParallelContext::CommunicatorSub());
    }
    return result;
}